

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_dist.cpp
# Opt level: O1

Remotes * __thiscall
Omega_h::Dist::exch(Remotes *__return_storage_ptr__,Dist *this,Remotes *data,Int width)

{
  int *piVar1;
  void **ppvVar2;
  Alloc *pAVar3;
  undefined8 uVar4;
  Read<int> idxs;
  Read<int> ranks;
  Read<int> local_90;
  LOs local_80;
  Alloc *local_70;
  void *local_68;
  undefined1 local_60 [40];
  void *local_38;
  
  local_60._16_8_ = (data->ranks).write_.shared_alloc_.alloc;
  if ((local_60._16_8_ & 7) == 0 && (Alloc *)local_60._16_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_60._16_8_ = ((Alloc *)local_60._16_8_)->size * 8 + 1;
    }
    else {
      ((Alloc *)local_60._16_8_)->use_count = ((Alloc *)local_60._16_8_)->use_count + 1;
    }
  }
  local_60._24_8_ = (data->ranks).write_.shared_alloc_.direct_ptr;
  exch<int>((Dist *)(local_60 + 0x20),(Read<int> *)this,(int)local_60 + 0x10);
  uVar4 = local_60._16_8_;
  if ((local_60._16_8_ & 7) == 0 && (Alloc *)local_60._16_8_ != (Alloc *)0x0) {
    piVar1 = (int *)(local_60._16_8_ + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_60._16_8_);
      operator_delete((void *)uVar4,0x48);
    }
  }
  local_70 = (data->idxs).write_.shared_alloc_.alloc;
  if (((ulong)local_70 & 7) == 0 && local_70 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_70 = (Alloc *)(local_70->size * 8 + 1);
    }
    else {
      local_70->use_count = local_70->use_count + 1;
    }
  }
  local_68 = (data->idxs).write_.shared_alloc_.direct_ptr;
  exch<int>((Dist *)local_60,(Read<int> *)this,(Int)&local_70);
  pAVar3 = local_70;
  if (((ulong)local_70 & 7) == 0 && local_70 != (Alloc *)0x0) {
    piVar1 = &local_70->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_70);
      operator_delete(pAVar3,0x48);
    }
  }
  local_90.write_.shared_alloc_.alloc = (Alloc *)local_60._32_8_;
  if ((local_60._32_8_ & 7) == 0 && (Alloc *)local_60._32_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_90.write_.shared_alloc_.alloc = (Alloc *)(*(size_t *)local_60._32_8_ * 8 + 1);
    }
    else {
      *(int *)(local_60._32_8_ + 0x30) = *(int *)(local_60._32_8_ + 0x30) + 1;
    }
  }
  local_90.write_.shared_alloc_.direct_ptr = local_38;
  local_80.write_.shared_alloc_.alloc = (Alloc *)local_60._0_8_;
  if ((local_60._0_8_ & 7) == 0 && (element_type *)local_60._0_8_ != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_80.write_.shared_alloc_.alloc = (Alloc *)((long)*(Library **)local_60._0_8_ * 8 + 1);
    }
    else {
      ppvVar2 = &(((HostRead<int> *)(local_60._0_8_ + 0x28))->read_).write_.shared_alloc_.direct_ptr
      ;
      *(int *)ppvVar2 = *(int *)ppvVar2 + 1;
    }
  }
  local_80.write_.shared_alloc_.direct_ptr = (void *)local_60._8_8_;
  Remotes::Remotes(__return_storage_ptr__,&local_90,&local_80);
  pAVar3 = local_80.write_.shared_alloc_.alloc;
  if (((ulong)local_80.write_.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_80.write_.shared_alloc_.alloc != (element_type *)0x0) {
    ppvVar2 = &(((HostRead<int> *)&(local_80.write_.shared_alloc_.alloc)->ptr)->read_).write_.
               shared_alloc_.direct_ptr;
    *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
    if (*(int *)ppvVar2 == 0) {
      Alloc::~Alloc(local_80.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  pAVar3 = local_90.write_.shared_alloc_.alloc;
  if (((ulong)local_90.write_.shared_alloc_.alloc & 7) == 0 &&
      local_90.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_90.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_90.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  if ((local_60._0_8_ & 7) == 0 && (element_type *)local_60._0_8_ != (element_type *)0x0) {
    ppvVar2 = &(((HostRead<int> *)(local_60._0_8_ + 0x28))->read_).write_.shared_alloc_.direct_ptr;
    *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
    if (*(int *)ppvVar2 == 0) {
      Alloc::~Alloc((Alloc *)local_60._0_8_);
      operator_delete((void *)local_60._0_8_,0x48);
    }
  }
  if ((local_60._32_8_ & 7) == 0 && (Alloc *)local_60._32_8_ != (Alloc *)0x0) {
    piVar1 = (int *)(local_60._32_8_ + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_60._32_8_);
      operator_delete((void *)local_60._32_8_,0x48);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Remotes Dist::exch(Remotes data, Int width) const {
  auto ranks = exch(data.ranks, width);
  auto idxs = exch(data.idxs, width);
  return Remotes(ranks, idxs);
}